

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_segment_tree.cpp
# Opt level: O2

void __thiscall
duckdb::WindowSegmentTreeGlobalState::WindowSegmentTreeGlobalState
          (WindowSegmentTreeGlobalState *this,ClientContext *context,WindowSegmentTree *aggregator,
          idx_t group_count)

{
  vector<unsigned_long,_true> *this_00;
  pointer paVar1;
  unsigned_long uVar2;
  _Head_base<0UL,_duckdb::vector<std::atomic<unsigned_long>,_true>_*,_false> _Var3;
  unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>,_true>
  *puVar4;
  reference pvVar5;
  type pvVar6;
  pointer paVar7;
  idx_t iVar8;
  size_type __n;
  unsigned_long local_60;
  _Head_base<0UL,_duckdb::vector<std::atomic<unsigned_long>,_true>_*,_false> local_58;
  unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>,_true>
  *local_50;
  unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>,_true>
  *local_48;
  WindowAggregateStates *local_40;
  unsigned_long local_38;
  
  WindowAggregatorGlobalState::WindowAggregatorGlobalState
            (&this->super_WindowAggregatorGlobalState,context,&aggregator->super_WindowAggregator,
             group_count);
  (this->super_WindowAggregatorGlobalState).super_WindowAggregatorState._vptr_WindowAggregatorState
       = (_func_int **)&PTR__WindowSegmentTreeGlobalState_027cb7e0;
  this->tree = aggregator;
  local_40 = &this->levels_flat_native;
  WindowAggregateStates::WindowAggregateStates
            (local_40,&(this->super_WindowAggregatorGlobalState).aggr);
  this_00 = &this->levels_flat_start;
  (this->levels_flat_start).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->levels_flat_start).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->levels_flat_start).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48 = &this->build_started;
  local_50 = &this->build_completed;
  (this->build_started).
  super_unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::vector<std::atomic<unsigned_long>,_true>_*,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>_>
  .super__Head_base<0UL,_duckdb::vector<std::atomic<unsigned_long>,_true>_*,_false>._M_head_impl =
       (vector<std::atomic<unsigned_long>,_true> *)0x0;
  (this->build_completed).
  super_unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::vector<std::atomic<unsigned_long>,_true>_*,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>_>
  .super__Head_base<0UL,_duckdb::vector<std::atomic<unsigned_long>,_true>_*,_false>._M_head_impl =
       (vector<std::atomic<unsigned_long>,_true> *)0x0;
  (this->tree_allocators).
  super_vector<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tree_allocators).
  super_vector<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tree_allocators).
  super_vector<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60 = 0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,&local_60);
  local_60 = 0;
  __n = 0xffffffffffffffff;
  while( true ) {
    uVar2 = local_60;
    iVar8 = group_count;
    if (__n + 1 != 0) {
      pvVar5 = vector<unsigned_long,_true>::get<true>(this_00,__n);
      iVar8 = uVar2 - *pvVar5;
    }
    if (iVar8 < 2) break;
    local_60 = local_60 + (iVar8 + 0xf >> 4);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,&local_60);
    __n = __n + 1;
  }
  if (local_60 == 0) {
    local_60 = 1;
  }
  WindowAggregateStates::Initialize(local_40,local_60);
  LOCK();
  (this->build_level).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  local_38 = (long)(this->levels_flat_start).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->levels_flat_start).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  make_uniq<duckdb::vector<std::atomic<unsigned_long>,true>,unsigned_long>
            ((duckdb *)&local_58,&local_38);
  puVar4 = local_48;
  _Var3._M_head_impl = local_58._M_head_impl;
  local_58._M_head_impl = (pointer)0x0;
  ::std::
  __uniq_ptr_impl<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>_>
  ::reset((__uniq_ptr_impl<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>_>
           *)local_48,_Var3._M_head_impl);
  ::std::
  unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>_>
  ::~unique_ptr((unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>_>
                 *)&local_58);
  pvVar6 = unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>,_true>
           ::operator*(puVar4);
  puVar4 = local_50;
  paVar1 = (pvVar6->
           super_vector<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>).
           super__Vector_base<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (paVar7 = (pvVar6->
                super_vector<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>
                ).
                super__Vector_base<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start; paVar7 != paVar1; paVar7 = paVar7 + 1) {
    LOCK();
    (paVar7->super___atomic_base<unsigned_long>)._M_i = 0;
    UNLOCK();
  }
  local_38 = (long)(this->levels_flat_start).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->levels_flat_start).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  make_uniq<duckdb::vector<std::atomic<unsigned_long>,true>,unsigned_long>
            ((duckdb *)&local_58,&local_38);
  _Var3._M_head_impl = local_58._M_head_impl;
  local_58._M_head_impl = (vector<std::atomic<unsigned_long>,_true> *)0x0;
  ::std::
  __uniq_ptr_impl<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>_>
  ::reset((__uniq_ptr_impl<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>_>
           *)puVar4,_Var3._M_head_impl);
  ::std::
  unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>_>
  ::~unique_ptr((unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>_>
                 *)&local_58);
  pvVar6 = unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>,_true>
           ::operator*(puVar4);
  paVar1 = (pvVar6->
           super_vector<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>).
           super__Vector_base<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (paVar7 = (pvVar6->
                super_vector<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>
                ).
                super__Vector_base<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start; paVar7 != paVar1; paVar7 = paVar7 + 1) {
    LOCK();
    (paVar7->super___atomic_base<unsigned_long>)._M_i = 0;
    UNLOCK();
  }
  return;
}

Assistant:

WindowSegmentTreeGlobalState::WindowSegmentTreeGlobalState(ClientContext &context, const WindowSegmentTree &aggregator,
                                                           idx_t group_count)
    : WindowAggregatorGlobalState(context, aggregator, group_count), tree(aggregator), levels_flat_native(aggr) {

	D_ASSERT(!aggregator.wexpr.children.empty());

	// compute space required to store internal nodes of segment tree
	levels_flat_start.push_back(0);

	idx_t levels_flat_offset = 0;
	idx_t level_current = 0;
	// level 0 is data itself
	idx_t level_size;
	// iterate over the levels of the segment tree
	while ((level_size =
	            (level_current == 0 ? group_count : levels_flat_offset - levels_flat_start[level_current - 1])) > 1) {
		for (idx_t pos = 0; pos < level_size; pos += TREE_FANOUT) {
			levels_flat_offset++;
		}

		levels_flat_start.push_back(levels_flat_offset);
		level_current++;
	}

	// Corner case: single element in the window
	if (levels_flat_offset == 0) {
		++levels_flat_offset;
	}

	levels_flat_native.Initialize(levels_flat_offset);

	// Start by building from the bottom level
	build_level = 0;

	build_started = make_uniq<AtomicCounters>(levels_flat_start.size());
	for (auto &counter : *build_started) {
		counter = 0;
	}

	build_completed = make_uniq<AtomicCounters>(levels_flat_start.size());
	for (auto &counter : *build_completed) {
		counter = 0;
	}
}